

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O1

void * stbi__psd_load(stbi__context *s,int *x,int *y,int *comp,int req_comp,stbi__result_info *ri,
                     int bpc)

{
  ushort uVar1;
  short sVar2;
  stbi_uc sVar3;
  stbi_uc sVar4;
  byte bVar5;
  char cVar6;
  stbi__uint16 sVar7;
  stbi__uint32 sVar8;
  int iVar9;
  stbi__uint32 x_00;
  stbi__uint32 sVar10;
  uint uVar11;
  char *pcVar12;
  stbi__uint16 *data;
  stbi__uint16 *psVar13;
  ulong uVar14;
  uint pixelCount;
  ulong uVar15;
  ulong uVar16;
  stbi__uint16 *psVar17;
  long lVar18;
  uint uVar19;
  long in_FS_OFFSET;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  int iVar31;
  int iVar32;
  undefined1 auVar26 [16];
  int iVar33;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  float fVar64;
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  int iVar83;
  float fVar84;
  int iVar91;
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 in_XMM5 [16];
  undefined1 auVar92 [16];
  undefined1 in_XMM6 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  stbi__uint16 *local_90;
  stbi__uint16 *local_70;
  
  sVar8 = stbi__get32be(s);
  if (sVar8 != 0x38425053) {
    pcVar12 = "not PSD";
    goto LAB_001363fe;
  }
  sVar3 = stbi__get8(s);
  sVar4 = stbi__get8(s);
  if (CONCAT11(sVar3,sVar4) != 1) {
    pcVar12 = "wrong version";
    goto LAB_001363fe;
  }
  if ((s->io).read == (_func_int_void_ptr_char_ptr_int *)0x0) {
LAB_001363a0:
    s->img_buffer = s->img_buffer + 6;
  }
  else {
    iVar9 = (int)s->img_buffer_end - *(int *)&s->img_buffer;
    if (5 < iVar9) goto LAB_001363a0;
    s->img_buffer = s->img_buffer_end;
    (*(s->io).skip)(s->io_user_data,6 - iVar9);
  }
  sVar3 = stbi__get8(s);
  bVar5 = stbi__get8(s);
  uVar19 = (uint)CONCAT11(sVar3,bVar5);
  if (0x10 < uVar19) {
    pcVar12 = "wrong channel count";
    goto LAB_001363fe;
  }
  sVar8 = stbi__get32be(s);
  x_00 = stbi__get32be(s);
  if (((int)sVar8 < 0x1000001) && ((int)x_00 < 0x1000001)) {
    sVar3 = stbi__get8(s);
    sVar4 = stbi__get8(s);
    sVar2 = CONCAT11(sVar3,sVar4);
    if ((sVar2 != 8) && (sVar2 != 0x10)) {
      pcVar12 = "unsupported bit depth";
      goto LAB_001363fe;
    }
    sVar3 = stbi__get8(s);
    sVar4 = stbi__get8(s);
    if (CONCAT11(sVar3,sVar4) != 3) {
      pcVar12 = "wrong color format";
      goto LAB_001363fe;
    }
    sVar10 = stbi__get32be(s);
    stbi__skip(s,sVar10);
    sVar10 = stbi__get32be(s);
    stbi__skip(s,sVar10);
    sVar10 = stbi__get32be(s);
    stbi__skip(s,sVar10);
    uVar11 = stbi__get16be(s);
    if (1 < uVar11) {
      pcVar12 = "bad compression";
      goto LAB_001363fe;
    }
    iVar9 = stbi__mad3sizes_valid(4,x_00,sVar8,0);
    if (iVar9 != 0) {
      if (((bpc == 0x10) && (sVar2 == 0x10)) && (uVar11 == 0)) {
        data = (stbi__uint16 *)stbi__malloc_mad3(8,x_00,sVar8,0);
        ri->bits_per_channel = 0x10;
      }
      else {
        data = (stbi__uint16 *)malloc((long)(int)(sVar8 * x_00 * 4));
      }
      if (data != (stbi__uint16 *)0x0) {
        pixelCount = x_00 * sVar8;
        uVar16 = (ulong)pixelCount;
        if (uVar11 == 0) {
          lVar18 = uVar16 - 1;
          auVar22._8_4_ = (int)lVar18;
          auVar22._0_8_ = lVar18;
          auVar22._12_4_ = (int)((ulong)lVar18 >> 0x20);
          psVar17 = data + 0x1e;
          psVar13 = data + 0x1c;
          uVar15 = 0;
          auVar99._8_4_ = 0xffffffff;
          auVar99._0_8_ = 0xffffffffffffffff;
          auVar99._12_4_ = 0xffffffff;
          auVar92 = _DAT_0015c090;
          local_90 = data;
          local_70 = data;
          do {
            if (uVar15 < uVar19) {
              if (ri->bits_per_channel == 0x10) {
                if (0 < (int)pixelCount) {
                  lVar18 = 0;
                  do {
                    sVar3 = stbi__get8(s);
                    sVar4 = stbi__get8(s);
                    auVar92 = _DAT_0015c090;
                    auVar99._8_4_ = 0xffffffff;
                    auVar99._0_8_ = 0xffffffffffffffff;
                    auVar99._12_4_ = 0xffffffff;
                    local_70[lVar18 * 4] = CONCAT11(sVar3,sVar4);
                    lVar18 = lVar18 + 1;
                  } while (pixelCount != (uint)lVar18);
                }
              }
              else if (sVar2 == 0x10) {
                if (0 < (int)pixelCount) {
                  lVar18 = 0;
                  do {
                    sVar3 = stbi__get8(s);
                    stbi__get8(s);
                    auVar92 = _DAT_0015c090;
                    auVar99._8_4_ = 0xffffffff;
                    auVar99._0_8_ = 0xffffffffffffffff;
                    auVar99._12_4_ = 0xffffffff;
                    *(stbi_uc *)(local_90 + lVar18 * 2) = sVar3;
                    lVar18 = lVar18 + 1;
                  } while (pixelCount != (uint)lVar18);
                }
              }
              else if (0 < (int)pixelCount) {
                lVar18 = 0;
                do {
                  sVar3 = stbi__get8(s);
                  auVar92 = _DAT_0015c090;
                  auVar99._8_4_ = 0xffffffff;
                  auVar99._0_8_ = 0xffffffffffffffff;
                  auVar99._12_4_ = 0xffffffff;
                  *(stbi_uc *)(local_90 + lVar18 * 2) = sVar3;
                  lVar18 = lVar18 + 1;
                } while (pixelCount != (uint)lVar18);
              }
            }
            else if (sVar2 == 0x10 && bpc == 0x10) {
              if (0 < (int)pixelCount) {
                sVar7 = -(ushort)(uVar15 == 3);
                uVar14 = 0;
                do {
                  auVar23._8_4_ = (int)uVar14;
                  auVar23._0_8_ = uVar14;
                  auVar23._12_4_ = (int)(uVar14 >> 0x20);
                  auVar28 = auVar22 ^ auVar92;
                  auVar47 = (auVar23 | _DAT_0015c0b0) ^ auVar92;
                  iVar9 = auVar28._0_4_;
                  iVar83 = -(uint)(iVar9 < auVar47._0_4_);
                  iVar31 = auVar28._4_4_;
                  auVar49._4_4_ = -(uint)(iVar31 < auVar47._4_4_);
                  iVar32 = auVar28._8_4_;
                  iVar91 = -(uint)(iVar32 < auVar47._8_4_);
                  iVar33 = auVar28._12_4_;
                  auVar49._12_4_ = -(uint)(iVar33 < auVar47._12_4_);
                  auVar74._4_4_ = iVar83;
                  auVar74._0_4_ = iVar83;
                  auVar74._8_4_ = iVar91;
                  auVar74._12_4_ = iVar91;
                  auVar28 = pshuflw(in_XMM5,auVar74,0xe8);
                  auVar48._4_4_ = -(uint)(auVar47._4_4_ == iVar31);
                  auVar48._12_4_ = -(uint)(auVar47._12_4_ == iVar33);
                  auVar48._0_4_ = auVar48._4_4_;
                  auVar48._8_4_ = auVar48._12_4_;
                  auVar97 = pshuflw(in_XMM6,auVar48,0xe8);
                  auVar49._0_4_ = auVar49._4_4_;
                  auVar49._8_4_ = auVar49._12_4_;
                  auVar47 = pshuflw(auVar28,auVar49,0xe8);
                  auVar47 = (auVar47 | auVar97 & auVar28) ^ auVar99;
                  auVar47 = packssdw(auVar47,auVar47);
                  if ((auVar47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                    psVar13[uVar14 * 4 + -0x1c] = sVar7;
                  }
                  auVar49 = auVar48 & auVar74 | auVar49;
                  auVar47 = packssdw(auVar49,auVar49);
                  auVar47 = packssdw(auVar47 ^ auVar99,auVar47 ^ auVar99);
                  if ((auVar47._0_4_ >> 0x10 & 1) != 0) {
                    psVar13[uVar14 * 4 + -0x18] = sVar7;
                  }
                  auVar47 = (auVar23 | _DAT_0015c0d0) ^ auVar92;
                  iVar83 = -(uint)(iVar9 < auVar47._0_4_);
                  auVar88._4_4_ = -(uint)(iVar31 < auVar47._4_4_);
                  iVar91 = -(uint)(iVar32 < auVar47._8_4_);
                  auVar88._12_4_ = -(uint)(iVar33 < auVar47._12_4_);
                  auVar50._4_4_ = iVar83;
                  auVar50._0_4_ = iVar83;
                  auVar50._8_4_ = iVar91;
                  auVar50._12_4_ = iVar91;
                  auVar75._4_4_ = -(uint)(auVar47._4_4_ == iVar31);
                  auVar75._12_4_ = -(uint)(auVar47._12_4_ == iVar33);
                  auVar75._0_4_ = auVar75._4_4_;
                  auVar75._8_4_ = auVar75._12_4_;
                  auVar88._0_4_ = auVar88._4_4_;
                  auVar88._8_4_ = auVar88._12_4_;
                  auVar47 = auVar75 & auVar50 | auVar88;
                  auVar47 = packssdw(auVar47,auVar47);
                  auVar47 = packssdw(auVar47 ^ auVar99,auVar47 ^ auVar99);
                  if ((auVar47 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                    psVar13[uVar14 * 4 + -0x14] = sVar7;
                  }
                  auVar51 = pshufhw(auVar50,auVar50,0x84);
                  auVar26 = pshufhw(auVar75,auVar75,0x84);
                  auVar52 = pshufhw(auVar51,auVar88,0x84);
                  auVar51 = (auVar52 | auVar26 & auVar51) ^ auVar99;
                  auVar51 = packssdw(auVar51,auVar51);
                  if ((auVar51 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                    psVar13[uVar14 * 4 + -0x10] = sVar7;
                  }
                  auVar51 = (auVar23 | _DAT_00160cc0) ^ auVar92;
                  iVar83 = -(uint)(iVar9 < auVar51._0_4_);
                  auVar54._4_4_ = -(uint)(iVar31 < auVar51._4_4_);
                  iVar91 = -(uint)(iVar32 < auVar51._8_4_);
                  auVar54._12_4_ = -(uint)(iVar33 < auVar51._12_4_);
                  auVar76._4_4_ = iVar83;
                  auVar76._0_4_ = iVar83;
                  auVar76._8_4_ = iVar91;
                  auVar76._12_4_ = iVar91;
                  auVar47 = pshuflw(auVar47,auVar76,0xe8);
                  auVar53._4_4_ = -(uint)(auVar51._4_4_ == iVar31);
                  auVar53._12_4_ = -(uint)(auVar51._12_4_ == iVar33);
                  auVar53._0_4_ = auVar53._4_4_;
                  auVar53._8_4_ = auVar53._12_4_;
                  in_XMM6 = pshuflw(auVar97 & auVar28,auVar53,0xe8);
                  in_XMM6 = in_XMM6 & auVar47;
                  auVar54._0_4_ = auVar54._4_4_;
                  auVar54._8_4_ = auVar54._12_4_;
                  auVar28 = pshuflw(auVar47,auVar54,0xe8);
                  auVar28 = (auVar28 | in_XMM6) ^ auVar99;
                  in_XMM5 = packssdw(auVar28,auVar28);
                  if ((in_XMM5 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                    psVar13[uVar14 * 4 + -0xc] = sVar7;
                  }
                  auVar54 = auVar53 & auVar76 | auVar54;
                  auVar28 = packssdw(auVar54,auVar54);
                  auVar28 = packssdw(auVar28 ^ auVar99,auVar28 ^ auVar99);
                  if ((auVar28 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
                    psVar13[uVar14 * 4 + -8] = sVar7;
                  }
                  auVar28 = (auVar23 | _DAT_00160cb0) ^ auVar92;
                  auVar77._0_4_ = -(uint)(iVar9 < auVar28._0_4_);
                  auVar77._4_4_ = -(uint)(iVar31 < auVar28._4_4_);
                  auVar77._8_4_ = -(uint)(iVar32 < auVar28._8_4_);
                  auVar77._12_4_ = -(uint)(iVar33 < auVar28._12_4_);
                  auVar55._4_4_ = auVar77._0_4_;
                  auVar55._0_4_ = auVar77._0_4_;
                  auVar55._8_4_ = auVar77._8_4_;
                  auVar55._12_4_ = auVar77._8_4_;
                  auVar24._4_4_ = -(uint)(auVar28._4_4_ == iVar31);
                  auVar24._12_4_ = -(uint)(auVar28._12_4_ == iVar33);
                  auVar24._0_4_ = auVar24._4_4_;
                  auVar24._8_4_ = auVar24._12_4_;
                  auVar29._4_4_ = auVar77._4_4_;
                  auVar29._0_4_ = auVar77._4_4_;
                  auVar29._8_4_ = auVar77._12_4_;
                  auVar29._12_4_ = auVar77._12_4_;
                  auVar28 = packssdw(auVar77,auVar24 & auVar55 | auVar29);
                  auVar28 = packssdw(auVar28 ^ auVar99,auVar28 ^ auVar99);
                  if ((auVar28 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                    psVar13[uVar14 * 4 + -4] = sVar7;
                  }
                  auVar97 = pshufhw(auVar55,auVar55,0x84);
                  auVar28 = pshufhw(auVar24,auVar24,0x84);
                  auVar47 = pshufhw(auVar29,auVar29,0x84);
                  auVar28 = packssdw(auVar28 & auVar97,(auVar47 | auVar28 & auVar97) ^ auVar99);
                  if ((auVar28 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                    psVar13[uVar14 * 4] = sVar7;
                  }
                  uVar14 = uVar14 + 8;
                } while ((pixelCount + 7 & 0xfffffff8) != uVar14);
              }
            }
            else if (0 < (int)pixelCount) {
              cVar6 = -(uVar15 == 3);
              uVar14 = 0;
              do {
                auVar28._8_4_ = (int)uVar14;
                auVar28._0_8_ = uVar14;
                auVar28._12_4_ = (int)(uVar14 >> 0x20);
                auVar47 = auVar22 ^ auVar92;
                auVar97 = (auVar28 | _DAT_0015c0b0) ^ auVar92;
                iVar9 = auVar47._0_4_;
                iVar83 = -(uint)(iVar9 < auVar97._0_4_);
                iVar31 = auVar47._4_4_;
                auVar51._4_4_ = -(uint)(iVar31 < auVar97._4_4_);
                iVar32 = auVar47._8_4_;
                iVar91 = -(uint)(iVar32 < auVar97._8_4_);
                iVar33 = auVar47._12_4_;
                auVar51._12_4_ = -(uint)(iVar33 < auVar97._12_4_);
                auVar52._4_4_ = iVar83;
                auVar52._0_4_ = iVar83;
                auVar52._8_4_ = iVar91;
                auVar52._12_4_ = iVar91;
                auVar26 = pshuflw(in_XMM5,auVar52,0xe8);
                auVar47._4_4_ = -(uint)(auVar97._4_4_ == iVar31);
                auVar47._12_4_ = -(uint)(auVar97._12_4_ == iVar33);
                auVar47._0_4_ = auVar47._4_4_;
                auVar47._8_4_ = auVar47._12_4_;
                auVar34 = pshuflw(in_XMM6,auVar47,0xe8);
                auVar51._0_4_ = auVar51._4_4_;
                auVar51._8_4_ = auVar51._12_4_;
                auVar97 = pshuflw(auVar26,auVar51,0xe8);
                auVar97 = (auVar97 | auVar34 & auVar26) ^ auVar99;
                auVar97 = packssdw(auVar97,auVar97);
                if ((auVar97 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  *(char *)(psVar17 + uVar14 * 2 + -0x1e) = cVar6;
                }
                auVar51 = auVar47 & auVar52 | auVar51;
                auVar47 = packssdw(auVar51,auVar51);
                auVar47 = packssdw(auVar47 ^ auVar99,auVar47 ^ auVar99);
                auVar47 = packsswb(auVar47,auVar47);
                if ((auVar47._0_4_ >> 8 & 1) != 0) {
                  *(char *)(psVar17 + uVar14 * 2 + -0x1c) = cVar6;
                }
                auVar47 = (auVar28 | _DAT_0015c0d0) ^ auVar92;
                iVar83 = -(uint)(iVar9 < auVar47._0_4_);
                auVar67._4_4_ = -(uint)(iVar31 < auVar47._4_4_);
                iVar91 = -(uint)(iVar32 < auVar47._8_4_);
                auVar67._12_4_ = -(uint)(iVar33 < auVar47._12_4_);
                auVar97._4_4_ = iVar83;
                auVar97._0_4_ = iVar83;
                auVar97._8_4_ = iVar91;
                auVar97._12_4_ = iVar91;
                auVar93._4_4_ = -(uint)(auVar47._4_4_ == iVar31);
                auVar93._12_4_ = -(uint)(auVar47._12_4_ == iVar33);
                auVar93._0_4_ = auVar93._4_4_;
                auVar93._8_4_ = auVar93._12_4_;
                auVar67._0_4_ = auVar67._4_4_;
                auVar67._8_4_ = auVar67._12_4_;
                auVar47 = auVar93 & auVar97 | auVar67;
                auVar47 = packssdw(auVar47,auVar47);
                auVar47 = packssdw(auVar47 ^ auVar99,auVar47 ^ auVar99);
                auVar47 = packsswb(auVar47,auVar47);
                if ((auVar47._0_4_ >> 0x10 & 1) != 0) {
                  *(char *)(psVar17 + uVar14 * 2 + -0x1a) = cVar6;
                }
                auVar97 = pshufhw(auVar97,auVar97,0x84);
                auVar52 = pshufhw(auVar93,auVar93,0x84);
                auVar51 = pshufhw(auVar97,auVar67,0x84);
                auVar97 = (auVar51 | auVar52 & auVar97) ^ auVar99;
                auVar97 = packssdw(auVar97,auVar97);
                auVar97 = packsswb(auVar97,auVar97);
                if ((auVar97._0_4_ >> 0x18 & 1) != 0) {
                  *(char *)(psVar17 + uVar14 * 2 + -0x18) = cVar6;
                }
                auVar97 = (auVar28 | _DAT_00160cc0) ^ auVar92;
                iVar83 = -(uint)(iVar9 < auVar97._0_4_);
                auVar57._4_4_ = -(uint)(iVar31 < auVar97._4_4_);
                iVar91 = -(uint)(iVar32 < auVar97._8_4_);
                auVar57._12_4_ = -(uint)(iVar33 < auVar97._12_4_);
                auVar78._4_4_ = iVar83;
                auVar78._0_4_ = iVar83;
                auVar78._8_4_ = iVar91;
                auVar78._12_4_ = iVar91;
                auVar47 = pshuflw(auVar47,auVar78,0xe8);
                auVar56._4_4_ = -(uint)(auVar97._4_4_ == iVar31);
                auVar56._12_4_ = -(uint)(auVar97._12_4_ == iVar33);
                auVar56._0_4_ = auVar56._4_4_;
                auVar56._8_4_ = auVar56._12_4_;
                auVar51 = pshuflw(auVar34 & auVar26,auVar56,0xe8);
                auVar57._0_4_ = auVar57._4_4_;
                auVar57._8_4_ = auVar57._12_4_;
                auVar97 = pshuflw(auVar47,auVar57,0xe8);
                auVar97 = (auVar97 | auVar51 & auVar47) ^ auVar99;
                auVar97 = packssdw(auVar97,auVar97);
                auVar97 = packsswb(auVar97,auVar97);
                if ((auVar97 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                  *(char *)(psVar17 + uVar14 * 2 + -0x16) = cVar6;
                }
                auVar57 = auVar56 & auVar78 | auVar57;
                auVar97 = packssdw(auVar57,auVar57);
                auVar97 = packssdw(auVar97 ^ auVar99,auVar97 ^ auVar99);
                auVar97 = packsswb(auVar97,auVar97);
                if ((auVar97._4_2_ >> 8 & 1) != 0) {
                  *(char *)(psVar17 + uVar14 * 2 + -0x14) = cVar6;
                }
                auVar97 = (auVar28 | _DAT_00160cb0) ^ auVar92;
                iVar83 = -(uint)(iVar9 < auVar97._0_4_);
                auVar89._4_4_ = -(uint)(iVar31 < auVar97._4_4_);
                iVar91 = -(uint)(iVar32 < auVar97._8_4_);
                auVar89._12_4_ = -(uint)(iVar33 < auVar97._12_4_);
                auVar26._4_4_ = iVar83;
                auVar26._0_4_ = iVar83;
                auVar26._8_4_ = iVar91;
                auVar26._12_4_ = iVar91;
                auVar34._4_4_ = -(uint)(auVar97._4_4_ == iVar31);
                auVar34._12_4_ = -(uint)(auVar97._12_4_ == iVar33);
                auVar34._0_4_ = auVar34._4_4_;
                auVar34._8_4_ = auVar34._12_4_;
                auVar89._0_4_ = auVar89._4_4_;
                auVar89._8_4_ = auVar89._12_4_;
                auVar97 = auVar34 & auVar26 | auVar89;
                auVar97 = packssdw(auVar97,auVar97);
                auVar97 = packssdw(auVar97 ^ auVar99,auVar97 ^ auVar99);
                auVar97 = packsswb(auVar97,auVar97);
                if ((auVar97 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                  *(char *)(psVar17 + uVar14 * 2 + -0x12) = cVar6;
                }
                auVar52 = pshufhw(auVar26,auVar26,0x84);
                auVar34 = pshufhw(auVar34,auVar34,0x84);
                auVar26 = pshufhw(auVar52,auVar89,0x84);
                auVar52 = (auVar26 | auVar34 & auVar52) ^ auVar99;
                auVar52 = packssdw(auVar52,auVar52);
                auVar52 = packsswb(auVar52,auVar52);
                if ((auVar52._6_2_ >> 8 & 1) != 0) {
                  *(char *)(psVar17 + uVar14 * 2 + -0x10) = cVar6;
                }
                auVar52 = (auVar28 | _DAT_00160ca0) ^ auVar92;
                iVar83 = -(uint)(iVar9 < auVar52._0_4_);
                auVar59._4_4_ = -(uint)(iVar31 < auVar52._4_4_);
                iVar91 = -(uint)(iVar32 < auVar52._8_4_);
                auVar59._12_4_ = -(uint)(iVar33 < auVar52._12_4_);
                auVar79._4_4_ = iVar83;
                auVar79._0_4_ = iVar83;
                auVar79._8_4_ = iVar91;
                auVar79._12_4_ = iVar91;
                auVar97 = pshuflw(auVar97,auVar79,0xe8);
                auVar58._4_4_ = -(uint)(auVar52._4_4_ == iVar31);
                auVar58._12_4_ = -(uint)(auVar52._12_4_ == iVar33);
                auVar58._0_4_ = auVar58._4_4_;
                auVar58._8_4_ = auVar58._12_4_;
                auVar51 = pshuflw(auVar51 & auVar47,auVar58,0xe8);
                auVar59._0_4_ = auVar59._4_4_;
                auVar59._8_4_ = auVar59._12_4_;
                auVar47 = pshuflw(auVar97,auVar59,0xe8);
                auVar47 = (auVar47 | auVar51 & auVar97) ^ auVar99;
                auVar47 = packssdw(auVar47,auVar47);
                auVar47 = packsswb(auVar47,auVar47);
                if ((auVar47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  *(char *)(psVar17 + uVar14 * 2 + -0xe) = cVar6;
                }
                auVar59 = auVar58 & auVar79 | auVar59;
                auVar47 = packssdw(auVar59,auVar59);
                auVar47 = packssdw(auVar47 ^ auVar99,auVar47 ^ auVar99);
                auVar47 = packsswb(auVar47,auVar47);
                if ((auVar47._8_2_ >> 8 & 1) != 0) {
                  *(char *)(psVar17 + uVar14 * 2 + -0xc) = cVar6;
                }
                auVar47 = (auVar28 | _DAT_00160c90) ^ auVar92;
                iVar83 = -(uint)(iVar9 < auVar47._0_4_);
                auVar90._4_4_ = -(uint)(iVar31 < auVar47._4_4_);
                iVar91 = -(uint)(iVar32 < auVar47._8_4_);
                auVar90._12_4_ = -(uint)(iVar33 < auVar47._12_4_);
                auVar60._4_4_ = iVar83;
                auVar60._0_4_ = iVar83;
                auVar60._8_4_ = iVar91;
                auVar60._12_4_ = iVar91;
                auVar80._4_4_ = -(uint)(auVar47._4_4_ == iVar31);
                auVar80._12_4_ = -(uint)(auVar47._12_4_ == iVar33);
                auVar80._0_4_ = auVar80._4_4_;
                auVar80._8_4_ = auVar80._12_4_;
                auVar90._0_4_ = auVar90._4_4_;
                auVar90._8_4_ = auVar90._12_4_;
                auVar47 = auVar80 & auVar60 | auVar90;
                auVar47 = packssdw(auVar47,auVar47);
                auVar47 = packssdw(auVar47 ^ auVar99,auVar47 ^ auVar99);
                auVar47 = packsswb(auVar47,auVar47);
                if ((auVar47 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
                  *(char *)(psVar17 + uVar14 * 2 + -10) = cVar6;
                }
                auVar52 = pshufhw(auVar60,auVar60,0x84);
                auVar34 = pshufhw(auVar80,auVar80,0x84);
                auVar26 = pshufhw(auVar52,auVar90,0x84);
                auVar52 = (auVar26 | auVar34 & auVar52) ^ auVar99;
                auVar52 = packssdw(auVar52,auVar52);
                auVar52 = packsswb(auVar52,auVar52);
                if ((auVar52._10_2_ >> 8 & 1) != 0) {
                  *(char *)(psVar17 + uVar14 * 2 + -8) = cVar6;
                }
                auVar52 = (auVar28 | _DAT_00160c80) ^ auVar92;
                iVar83 = -(uint)(iVar9 < auVar52._0_4_);
                auVar62._4_4_ = -(uint)(iVar31 < auVar52._4_4_);
                iVar91 = -(uint)(iVar32 < auVar52._8_4_);
                auVar62._12_4_ = -(uint)(iVar33 < auVar52._12_4_);
                auVar81._4_4_ = iVar83;
                auVar81._0_4_ = iVar83;
                auVar81._8_4_ = iVar91;
                auVar81._12_4_ = iVar91;
                auVar47 = pshuflw(auVar47,auVar81,0xe8);
                auVar61._4_4_ = -(uint)(auVar52._4_4_ == iVar31);
                auVar61._12_4_ = -(uint)(auVar52._12_4_ == iVar33);
                auVar61._0_4_ = auVar61._4_4_;
                auVar61._8_4_ = auVar61._12_4_;
                in_XMM6 = pshuflw(auVar51 & auVar97,auVar61,0xe8);
                in_XMM6 = in_XMM6 & auVar47;
                auVar62._0_4_ = auVar62._4_4_;
                auVar62._8_4_ = auVar62._12_4_;
                auVar47 = pshuflw(auVar47,auVar62,0xe8);
                auVar47 = (auVar47 | in_XMM6) ^ auVar99;
                auVar47 = packssdw(auVar47,auVar47);
                in_XMM5 = packsswb(auVar47,auVar47);
                if ((in_XMM5 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                  *(char *)(psVar17 + uVar14 * 2 + -6) = cVar6;
                }
                auVar62 = auVar61 & auVar81 | auVar62;
                auVar47 = packssdw(auVar62,auVar62);
                auVar47 = packssdw(auVar47 ^ auVar99,auVar47 ^ auVar99);
                auVar47 = packsswb(auVar47,auVar47);
                if ((auVar47._12_2_ >> 8 & 1) != 0) {
                  *(char *)(psVar17 + uVar14 * 2 + -4) = cVar6;
                }
                auVar28 = (auVar28 | _DAT_00160c70) ^ auVar92;
                auVar82._0_4_ = -(uint)(iVar9 < auVar28._0_4_);
                auVar82._4_4_ = -(uint)(iVar31 < auVar28._4_4_);
                auVar82._8_4_ = -(uint)(iVar32 < auVar28._8_4_);
                auVar82._12_4_ = -(uint)(iVar33 < auVar28._12_4_);
                auVar63._4_4_ = auVar82._0_4_;
                auVar63._0_4_ = auVar82._0_4_;
                auVar63._8_4_ = auVar82._8_4_;
                auVar63._12_4_ = auVar82._8_4_;
                auVar25._4_4_ = -(uint)(auVar28._4_4_ == iVar31);
                auVar25._12_4_ = -(uint)(auVar28._12_4_ == iVar33);
                auVar25._0_4_ = auVar25._4_4_;
                auVar25._8_4_ = auVar25._12_4_;
                auVar30._4_4_ = auVar82._4_4_;
                auVar30._0_4_ = auVar82._4_4_;
                auVar30._8_4_ = auVar82._12_4_;
                auVar30._12_4_ = auVar82._12_4_;
                auVar28 = packssdw(auVar82,auVar25 & auVar63 | auVar30);
                auVar28 = packssdw(auVar28 ^ auVar99,auVar28 ^ auVar99);
                auVar28 = packsswb(auVar28,auVar28);
                if ((auVar28 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                  *(char *)(psVar17 + uVar14 * 2 + -2) = cVar6;
                }
                auVar97 = pshufhw(auVar63,auVar63,0x84);
                auVar28 = pshufhw(auVar25,auVar25,0x84);
                auVar47 = pshufhw(auVar30,auVar30,0x84);
                auVar28 = packssdw(auVar28 & auVar97,(auVar47 | auVar28 & auVar97) ^ auVar99);
                auVar28 = packsswb(auVar28,auVar28);
                if ((auVar28._14_2_ >> 8 & 1) != 0) {
                  *(char *)(psVar17 + uVar14 * 2) = cVar6;
                }
                uVar14 = uVar14 + 0x10;
              } while ((pixelCount + 0xf & 0xfffffff0) != uVar14);
            }
            uVar15 = uVar15 + 1;
            psVar17 = (stbi__uint16 *)((long)psVar17 + 1);
            psVar13 = psVar13 + 1;
            local_90 = (stbi__uint16 *)((long)local_90 + 1);
            local_70 = local_70 + 1;
          } while (uVar15 != 4);
        }
        else {
          stbi__skip(s,bVar5 * sVar8 * 2);
          lVar18 = uVar16 - 1;
          auVar98._8_4_ = (int)lVar18;
          auVar98._0_8_ = lVar18;
          auVar98._12_4_ = (int)((ulong)lVar18 >> 0x20);
          psVar17 = data + 0x1e;
          uVar15 = 0;
          auVar92 = _DAT_00160c70;
          auVar22 = _DAT_00160c80;
          auVar99 = _DAT_00160c90;
          auVar28 = _DAT_00160ca0;
          auVar47 = _DAT_00160cb0;
          auVar97 = _DAT_00160cc0;
          auVar51 = _DAT_0015c0d0;
          auVar52 = _DAT_0015c0b0;
          do {
            if (uVar15 < uVar19) {
              iVar9 = stbi__psd_decode_rle(s,(stbi_uc *)((long)data + uVar15),pixelCount);
              auVar92 = _DAT_00160c70;
              auVar22 = _DAT_00160c80;
              auVar99 = _DAT_00160c90;
              auVar28 = _DAT_00160ca0;
              auVar47 = _DAT_00160cb0;
              auVar97 = _DAT_00160cc0;
              auVar51 = _DAT_0015c0d0;
              auVar52 = _DAT_0015c0b0;
              if (iVar9 == 0) {
                free(data);
                pcVar12 = "corrupt";
                goto LAB_001363fe;
              }
            }
            else if (0 < (int)pixelCount) {
              cVar6 = -(uVar15 == 3);
              uVar14 = 0;
              do {
                auVar20._8_4_ = (int)uVar14;
                auVar20._0_8_ = uVar14;
                auVar20._12_4_ = (int)(uVar14 >> 0x20);
                auVar26 = auVar98 ^ _DAT_0015c090;
                auVar34 = (auVar20 | auVar52) ^ _DAT_0015c090;
                iVar9 = auVar26._0_4_;
                iVar83 = -(uint)(iVar9 < auVar34._0_4_);
                iVar31 = auVar26._4_4_;
                auVar36._4_4_ = -(uint)(iVar31 < auVar34._4_4_);
                iVar32 = auVar26._8_4_;
                iVar91 = -(uint)(iVar32 < auVar34._8_4_);
                iVar33 = auVar26._12_4_;
                auVar36._12_4_ = -(uint)(iVar33 < auVar34._12_4_);
                auVar65._4_4_ = iVar83;
                auVar65._0_4_ = iVar83;
                auVar65._8_4_ = iVar91;
                auVar65._12_4_ = iVar91;
                auVar26 = pshuflw(in_XMM5,auVar65,0xe8);
                auVar35._4_4_ = -(uint)(auVar34._4_4_ == iVar31);
                auVar35._12_4_ = -(uint)(auVar34._12_4_ == iVar33);
                auVar35._0_4_ = auVar35._4_4_;
                auVar35._8_4_ = auVar35._12_4_;
                auVar93 = pshuflw(in_XMM6,auVar35,0xe8);
                auVar36._0_4_ = auVar36._4_4_;
                auVar36._8_4_ = auVar36._12_4_;
                auVar34 = pshuflw(auVar26,auVar36,0xe8);
                auVar94._8_4_ = 0xffffffff;
                auVar94._0_8_ = 0xffffffffffffffff;
                auVar94._12_4_ = 0xffffffff;
                auVar26 = (auVar34 | auVar93 & auVar26) ^ auVar94;
                auVar26 = packssdw(auVar26,auVar26);
                if ((auVar26 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  *(char *)(psVar17 + uVar14 * 2 + -0x1e) = cVar6;
                }
                auVar36 = auVar35 & auVar65 | auVar36;
                auVar26 = packssdw(auVar36,auVar36);
                auVar26 = packssdw(auVar26 ^ auVar94,auVar26 ^ auVar94);
                auVar26 = packsswb(auVar26,auVar26);
                if ((auVar26._0_4_ >> 8 & 1) != 0) {
                  *(char *)(psVar17 + uVar14 * 2 + -0x1c) = cVar6;
                }
                auVar26 = (auVar20 | auVar51) ^ _DAT_0015c090;
                iVar83 = -(uint)(iVar9 < auVar26._0_4_);
                auVar85._4_4_ = -(uint)(iVar31 < auVar26._4_4_);
                iVar91 = -(uint)(iVar32 < auVar26._8_4_);
                auVar85._12_4_ = -(uint)(iVar33 < auVar26._12_4_);
                auVar37._4_4_ = iVar83;
                auVar37._0_4_ = iVar83;
                auVar37._8_4_ = iVar91;
                auVar37._12_4_ = iVar91;
                auVar66._4_4_ = -(uint)(auVar26._4_4_ == iVar31);
                auVar66._12_4_ = -(uint)(auVar26._12_4_ == iVar33);
                auVar66._0_4_ = auVar66._4_4_;
                auVar66._8_4_ = auVar66._12_4_;
                auVar85._0_4_ = auVar85._4_4_;
                auVar85._8_4_ = auVar85._12_4_;
                auVar26 = auVar66 & auVar37 | auVar85;
                auVar26 = packssdw(auVar26,auVar26);
                auVar26 = packssdw(auVar26 ^ auVar94,auVar26 ^ auVar94);
                auVar26 = packsswb(auVar26,auVar26);
                if ((auVar26._0_4_ >> 0x10 & 1) != 0) {
                  *(char *)(psVar17 + uVar14 * 2 + -0x1a) = cVar6;
                }
                auVar34 = pshufhw(auVar37,auVar37,0x84);
                auVar67 = pshufhw(auVar66,auVar66,0x84);
                auVar93 = pshufhw(auVar34,auVar85,0x84);
                auVar34 = (auVar93 | auVar67 & auVar34) ^ auVar94;
                auVar34 = packssdw(auVar34,auVar34);
                auVar34 = packsswb(auVar34,auVar34);
                if ((auVar34._0_4_ >> 0x18 & 1) != 0) {
                  *(char *)(psVar17 + uVar14 * 2 + -0x18) = cVar6;
                }
                auVar34 = (auVar20 | auVar97) ^ _DAT_0015c090;
                iVar83 = -(uint)(iVar9 < auVar34._0_4_);
                auVar39._4_4_ = -(uint)(iVar31 < auVar34._4_4_);
                iVar91 = -(uint)(iVar32 < auVar34._8_4_);
                auVar39._12_4_ = -(uint)(iVar33 < auVar34._12_4_);
                auVar68._4_4_ = iVar83;
                auVar68._0_4_ = iVar83;
                auVar68._8_4_ = iVar91;
                auVar68._12_4_ = iVar91;
                auVar26 = pshuflw(auVar26,auVar68,0xe8);
                auVar38._4_4_ = -(uint)(auVar34._4_4_ == iVar31);
                auVar38._12_4_ = -(uint)(auVar34._12_4_ == iVar33);
                auVar38._0_4_ = auVar38._4_4_;
                auVar38._8_4_ = auVar38._12_4_;
                auVar93 = pshuflw(auVar94,auVar38,0xe8);
                auVar39._0_4_ = auVar39._4_4_;
                auVar39._8_4_ = auVar39._12_4_;
                auVar34 = pshuflw(auVar26,auVar39,0xe8);
                auVar95._8_4_ = 0xffffffff;
                auVar95._0_8_ = 0xffffffffffffffff;
                auVar95._12_4_ = 0xffffffff;
                auVar26 = (auVar34 | auVar93 & auVar26) ^ auVar95;
                auVar26 = packssdw(auVar26,auVar26);
                auVar26 = packsswb(auVar26,auVar26);
                if ((auVar26 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                  *(char *)(psVar17 + uVar14 * 2 + -0x16) = cVar6;
                }
                auVar39 = auVar38 & auVar68 | auVar39;
                auVar26 = packssdw(auVar39,auVar39);
                auVar26 = packssdw(auVar26 ^ auVar95,auVar26 ^ auVar95);
                auVar26 = packsswb(auVar26,auVar26);
                if ((auVar26._4_2_ >> 8 & 1) != 0) {
                  *(char *)(psVar17 + uVar14 * 2 + -0x14) = cVar6;
                }
                auVar26 = (auVar20 | auVar47) ^ _DAT_0015c090;
                iVar83 = -(uint)(iVar9 < auVar26._0_4_);
                auVar86._4_4_ = -(uint)(iVar31 < auVar26._4_4_);
                iVar91 = -(uint)(iVar32 < auVar26._8_4_);
                auVar86._12_4_ = -(uint)(iVar33 < auVar26._12_4_);
                auVar40._4_4_ = iVar83;
                auVar40._0_4_ = iVar83;
                auVar40._8_4_ = iVar91;
                auVar40._12_4_ = iVar91;
                auVar69._4_4_ = -(uint)(auVar26._4_4_ == iVar31);
                auVar69._12_4_ = -(uint)(auVar26._12_4_ == iVar33);
                auVar69._0_4_ = auVar69._4_4_;
                auVar69._8_4_ = auVar69._12_4_;
                auVar86._0_4_ = auVar86._4_4_;
                auVar86._8_4_ = auVar86._12_4_;
                auVar26 = auVar69 & auVar40 | auVar86;
                auVar26 = packssdw(auVar26,auVar26);
                auVar26 = packssdw(auVar26 ^ auVar95,auVar26 ^ auVar95);
                auVar26 = packsswb(auVar26,auVar26);
                if ((auVar26 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                  *(char *)(psVar17 + uVar14 * 2 + -0x12) = cVar6;
                }
                auVar34 = pshufhw(auVar40,auVar40,0x84);
                auVar67 = pshufhw(auVar69,auVar69,0x84);
                auVar93 = pshufhw(auVar34,auVar86,0x84);
                auVar34 = (auVar93 | auVar67 & auVar34) ^ auVar95;
                auVar34 = packssdw(auVar34,auVar34);
                auVar34 = packsswb(auVar34,auVar34);
                if ((auVar34._6_2_ >> 8 & 1) != 0) {
                  *(char *)(psVar17 + uVar14 * 2 + -0x10) = cVar6;
                }
                auVar34 = (auVar20 | auVar28) ^ _DAT_0015c090;
                iVar83 = -(uint)(iVar9 < auVar34._0_4_);
                auVar42._4_4_ = -(uint)(iVar31 < auVar34._4_4_);
                iVar91 = -(uint)(iVar32 < auVar34._8_4_);
                auVar42._12_4_ = -(uint)(iVar33 < auVar34._12_4_);
                auVar70._4_4_ = iVar83;
                auVar70._0_4_ = iVar83;
                auVar70._8_4_ = iVar91;
                auVar70._12_4_ = iVar91;
                auVar26 = pshuflw(auVar26,auVar70,0xe8);
                auVar41._4_4_ = -(uint)(auVar34._4_4_ == iVar31);
                auVar41._12_4_ = -(uint)(auVar34._12_4_ == iVar33);
                auVar41._0_4_ = auVar41._4_4_;
                auVar41._8_4_ = auVar41._12_4_;
                auVar93 = pshuflw(auVar95,auVar41,0xe8);
                auVar42._0_4_ = auVar42._4_4_;
                auVar42._8_4_ = auVar42._12_4_;
                auVar34 = pshuflw(auVar26,auVar42,0xe8);
                auVar96._8_4_ = 0xffffffff;
                auVar96._0_8_ = 0xffffffffffffffff;
                auVar96._12_4_ = 0xffffffff;
                auVar26 = (auVar34 | auVar93 & auVar26) ^ auVar96;
                auVar26 = packssdw(auVar26,auVar26);
                auVar26 = packsswb(auVar26,auVar26);
                if ((auVar26 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  *(char *)(psVar17 + uVar14 * 2 + -0xe) = cVar6;
                }
                auVar42 = auVar41 & auVar70 | auVar42;
                auVar26 = packssdw(auVar42,auVar42);
                auVar26 = packssdw(auVar26 ^ auVar96,auVar26 ^ auVar96);
                auVar26 = packsswb(auVar26,auVar26);
                if ((auVar26._8_2_ >> 8 & 1) != 0) {
                  *(char *)(psVar17 + uVar14 * 2 + -0xc) = cVar6;
                }
                auVar26 = (auVar20 | auVar99) ^ _DAT_0015c090;
                iVar83 = -(uint)(iVar9 < auVar26._0_4_);
                auVar87._4_4_ = -(uint)(iVar31 < auVar26._4_4_);
                iVar91 = -(uint)(iVar32 < auVar26._8_4_);
                auVar87._12_4_ = -(uint)(iVar33 < auVar26._12_4_);
                auVar43._4_4_ = iVar83;
                auVar43._0_4_ = iVar83;
                auVar43._8_4_ = iVar91;
                auVar43._12_4_ = iVar91;
                auVar71._4_4_ = -(uint)(auVar26._4_4_ == iVar31);
                auVar71._12_4_ = -(uint)(auVar26._12_4_ == iVar33);
                auVar71._0_4_ = auVar71._4_4_;
                auVar71._8_4_ = auVar71._12_4_;
                auVar87._0_4_ = auVar87._4_4_;
                auVar87._8_4_ = auVar87._12_4_;
                auVar26 = auVar71 & auVar43 | auVar87;
                auVar26 = packssdw(auVar26,auVar26);
                auVar26 = packssdw(auVar26 ^ auVar96,auVar26 ^ auVar96);
                auVar26 = packsswb(auVar26,auVar26);
                if ((auVar26 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
                  *(char *)(psVar17 + uVar14 * 2 + -10) = cVar6;
                }
                auVar34 = pshufhw(auVar43,auVar43,0x84);
                auVar67 = pshufhw(auVar71,auVar71,0x84);
                auVar93 = pshufhw(auVar34,auVar87,0x84);
                auVar34 = (auVar93 | auVar67 & auVar34) ^ auVar96;
                auVar34 = packssdw(auVar34,auVar34);
                auVar34 = packsswb(auVar34,auVar34);
                if ((auVar34._10_2_ >> 8 & 1) != 0) {
                  *(char *)(psVar17 + uVar14 * 2 + -8) = cVar6;
                }
                auVar34 = (auVar20 | auVar22) ^ _DAT_0015c090;
                iVar83 = -(uint)(iVar9 < auVar34._0_4_);
                auVar45._4_4_ = -(uint)(iVar31 < auVar34._4_4_);
                iVar91 = -(uint)(iVar32 < auVar34._8_4_);
                auVar45._12_4_ = -(uint)(iVar33 < auVar34._12_4_);
                auVar72._4_4_ = iVar83;
                auVar72._0_4_ = iVar83;
                auVar72._8_4_ = iVar91;
                auVar72._12_4_ = iVar91;
                auVar26 = pshuflw(auVar26,auVar72,0xe8);
                auVar44._4_4_ = -(uint)(auVar34._4_4_ == iVar31);
                auVar44._12_4_ = -(uint)(auVar34._12_4_ == iVar33);
                auVar44._0_4_ = auVar44._4_4_;
                auVar44._8_4_ = auVar44._12_4_;
                auVar93 = pshuflw(auVar96,auVar44,0xe8);
                auVar45._0_4_ = auVar45._4_4_;
                auVar45._8_4_ = auVar45._12_4_;
                auVar34 = pshuflw(auVar26,auVar45,0xe8);
                in_XMM6._8_4_ = 0xffffffff;
                in_XMM6._0_8_ = 0xffffffffffffffff;
                in_XMM6._12_4_ = 0xffffffff;
                auVar26 = (auVar34 | auVar93 & auVar26) ^ in_XMM6;
                auVar26 = packssdw(auVar26,auVar26);
                in_XMM5 = packsswb(auVar26,auVar26);
                if ((in_XMM5 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                  *(char *)(psVar17 + uVar14 * 2 + -6) = cVar6;
                }
                auVar45 = auVar44 & auVar72 | auVar45;
                auVar26 = packssdw(auVar45,auVar45);
                auVar26 = packssdw(auVar26 ^ in_XMM6,auVar26 ^ in_XMM6);
                auVar26 = packsswb(auVar26,auVar26);
                if ((auVar26._12_2_ >> 8 & 1) != 0) {
                  *(char *)(psVar17 + uVar14 * 2 + -4) = cVar6;
                }
                auVar26 = (auVar20 | auVar92) ^ _DAT_0015c090;
                auVar73._0_4_ = -(uint)(iVar9 < auVar26._0_4_);
                auVar73._4_4_ = -(uint)(iVar31 < auVar26._4_4_);
                auVar73._8_4_ = -(uint)(iVar32 < auVar26._8_4_);
                auVar73._12_4_ = -(uint)(iVar33 < auVar26._12_4_);
                auVar46._4_4_ = auVar73._0_4_;
                auVar46._0_4_ = auVar73._0_4_;
                auVar46._8_4_ = auVar73._8_4_;
                auVar46._12_4_ = auVar73._8_4_;
                auVar21._4_4_ = -(uint)(auVar26._4_4_ == iVar31);
                auVar21._12_4_ = -(uint)(auVar26._12_4_ == iVar33);
                auVar21._0_4_ = auVar21._4_4_;
                auVar21._8_4_ = auVar21._12_4_;
                auVar27._4_4_ = auVar73._4_4_;
                auVar27._0_4_ = auVar73._4_4_;
                auVar27._8_4_ = auVar73._12_4_;
                auVar27._12_4_ = auVar73._12_4_;
                auVar26 = packssdw(auVar73,auVar21 & auVar46 | auVar27);
                auVar26 = packssdw(auVar26 ^ in_XMM6,auVar26 ^ in_XMM6);
                auVar26 = packsswb(auVar26,auVar26);
                if ((auVar26 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                  *(char *)(psVar17 + uVar14 * 2 + -2) = cVar6;
                }
                auVar93 = pshufhw(auVar46,auVar46,0x84);
                auVar26 = pshufhw(auVar21,auVar21,0x84);
                auVar34 = pshufhw(auVar27,auVar27,0x84);
                auVar26 = packssdw(auVar26 & auVar93,(auVar34 | auVar26 & auVar93) ^ in_XMM6);
                auVar26 = packsswb(auVar26,auVar26);
                if ((auVar26._14_2_ >> 8 & 1) != 0) {
                  *(char *)(psVar17 + uVar14 * 2) = cVar6;
                }
                uVar14 = uVar14 + 0x10;
              } while ((pixelCount + 0xf & 0xfffffff0) != uVar14);
            }
            uVar15 = uVar15 + 1;
            psVar17 = (stbi__uint16 *)((long)psVar17 + 1);
          } while (uVar15 != 4);
        }
        if (3 < uVar19) {
          if (ri->bits_per_channel == 0x10) {
            if (0 < (int)pixelCount) {
              uVar15 = 0;
              do {
                uVar1 = data[uVar15 * 4 + 3];
                if ((uVar1 != 0) && (uVar1 != 0xffff)) {
                  fVar84 = 1.0 / ((float)uVar1 / 65535.0);
                  fVar64 = (1.0 - fVar84) * 65535.0;
                  auVar92._0_4_ =
                       (int)(fVar64 + fVar84 * (float)(*(uint *)(data + uVar15 * 4) & 0xffff));
                  auVar92._4_4_ =
                       (int)(fVar64 + fVar84 * (float)(*(uint *)(data + uVar15 * 4) >> 0x10));
                  auVar92._8_4_ = (int)(fVar64 + fVar84 * 0.0);
                  auVar92._12_4_ = (int)(fVar64 + fVar84 * 0.0);
                  auVar92 = pshuflw(auVar92,auVar92,0xe8);
                  *(int *)(data + uVar15 * 4) = auVar92._0_4_;
                  data[uVar15 * 4 + 2] =
                       (stbi__uint16)(int)((float)data[uVar15 * 4 + 2] * fVar84 + fVar64);
                }
                uVar15 = uVar15 + 1;
              } while (uVar16 != uVar15);
            }
          }
          else if (0 < (int)pixelCount) {
            uVar15 = 0;
            do {
              bVar5 = *(byte *)((long)data + uVar15 * 4 + 3);
              if ((bVar5 != 0) && (bVar5 != 0xff)) {
                fVar84 = 1.0 / ((float)bVar5 / 255.0);
                fVar64 = (1.0 - fVar84) * 255.0;
                *(char *)(data + uVar15 * 2) =
                     (char)(int)((float)(byte)data[uVar15 * 2] * fVar84 + fVar64);
                *(char *)((long)data + uVar15 * 4 + 1) =
                     (char)(int)((float)*(byte *)((long)data + uVar15 * 4 + 1) * fVar84 + fVar64);
                *(char *)(data + uVar15 * 2 + 1) =
                     (char)(int)((float)(byte)data[uVar15 * 2 + 1] * fVar84 + fVar64);
              }
              uVar15 = uVar15 + 1;
            } while (uVar16 != uVar15);
          }
        }
        if ((req_comp & 0xfffffffbU) != 0) {
          if (ri->bits_per_channel == 0x10) {
            data = stbi__convert_format16(data,4,req_comp,x_00,sVar8);
          }
          else {
            data = (stbi__uint16 *)stbi__convert_format((uchar *)data,4,req_comp,x_00,sVar8);
          }
          if (data == (stbi__uint16 *)0x0) {
            return (void *)0x0;
          }
        }
        if (comp != (int *)0x0) {
          *comp = 4;
        }
        *y = sVar8;
        *x = x_00;
        return data;
      }
      pcVar12 = "outofmem";
      goto LAB_001363fe;
    }
  }
  pcVar12 = "too large";
LAB_001363fe:
  *(char **)(in_FS_OFFSET + -0x10) = pcVar12;
  return (void *)0x0;
}

Assistant:

static void *stbi__psd_load(stbi__context *s, int *x, int *y, int *comp, int req_comp, stbi__result_info *ri, int bpc)
{
   int pixelCount;
   int channelCount, compression;
   int channel, i;
   int bitdepth;
   int w,h;
   stbi_uc *out;
   STBI_NOTUSED(ri);

   // Check identifier
   if (stbi__get32be(s) != 0x38425053)   // "8BPS"
      return stbi__errpuc("not PSD", "Corrupt PSD image");

   // Check file type version.
   if (stbi__get16be(s) != 1)
      return stbi__errpuc("wrong version", "Unsupported version of PSD image");

   // Skip 6 reserved bytes.
   stbi__skip(s, 6 );

   // Read the number of channels (R, G, B, A, etc).
   channelCount = stbi__get16be(s);
   if (channelCount < 0 || channelCount > 16)
      return stbi__errpuc("wrong channel count", "Unsupported number of channels in PSD image");

   // Read the rows and columns of the image.
   h = stbi__get32be(s);
   w = stbi__get32be(s);

   if (h > STBI_MAX_DIMENSIONS) return stbi__errpuc("too large","Very large image (corrupt?)");
   if (w > STBI_MAX_DIMENSIONS) return stbi__errpuc("too large","Very large image (corrupt?)");

   // Make sure the depth is 8 bits.
   bitdepth = stbi__get16be(s);
   if (bitdepth != 8 && bitdepth != 16)
      return stbi__errpuc("unsupported bit depth", "PSD bit depth is not 8 or 16 bit");

   // Make sure the color mode is RGB.
   // Valid options are:
   //   0: Bitmap
   //   1: Grayscale
   //   2: Indexed color
   //   3: RGB color
   //   4: CMYK color
   //   7: Multichannel
   //   8: Duotone
   //   9: Lab color
   if (stbi__get16be(s) != 3)
      return stbi__errpuc("wrong color format", "PSD is not in RGB color format");

   // Skip the Mode Data.  (It's the palette for indexed color; other info for other modes.)
   stbi__skip(s,stbi__get32be(s) );

   // Skip the image resources.  (resolution, pen tool paths, etc)
   stbi__skip(s, stbi__get32be(s) );

   // Skip the reserved data.
   stbi__skip(s, stbi__get32be(s) );

   // Find out if the data is compressed.
   // Known values:
   //   0: no compression
   //   1: RLE compressed
   compression = stbi__get16be(s);
   if (compression > 1)
      return stbi__errpuc("bad compression", "PSD has an unknown compression format");

   // Check size
   if (!stbi__mad3sizes_valid(4, w, h, 0))
      return stbi__errpuc("too large", "Corrupt PSD");

   // Create the destination image.

   if (!compression && bitdepth == 16 && bpc == 16) {
      out = (stbi_uc *) stbi__malloc_mad3(8, w, h, 0);
      ri->bits_per_channel = 16;
   } else
      out = (stbi_uc *) stbi__malloc(4 * w*h);

   if (!out) return stbi__errpuc("outofmem", "Out of memory");
   pixelCount = w*h;

   // Initialize the data to zero.
   //memset( out, 0, pixelCount * 4 );

   // Finally, the image data.
   if (compression) {
      // RLE as used by .PSD and .TIFF
      // Loop until you get the number of unpacked bytes you are expecting:
      //     Read the next source byte into n.
      //     If n is between 0 and 127 inclusive, copy the next n+1 bytes literally.
      //     Else if n is between -127 and -1 inclusive, copy the next byte -n+1 times.
      //     Else if n is 128, noop.
      // Endloop

      // The RLE-compressed data is preceded by a 2-byte data count for each row in the data,
      // which we're going to just skip.
      stbi__skip(s, h * channelCount * 2 );

      // Read the RLE data by channel.
      for (channel = 0; channel < 4; channel++) {
         stbi_uc *p;

         p = out+channel;
         if (channel >= channelCount) {
            // Fill this channel with default data.
            for (i = 0; i < pixelCount; i++, p += 4)
               *p = (channel == 3 ? 255 : 0);
         } else {
            // Read the RLE data.
            if (!stbi__psd_decode_rle(s, p, pixelCount)) {
               STBI_FREE(out);
               return stbi__errpuc("corrupt", "bad RLE data");
            }
         }
      }

   } else {
      // We're at the raw image data.  It's each channel in order (Red, Green, Blue, Alpha, ...)
      // where each channel consists of an 8-bit (or 16-bit) value for each pixel in the image.

      // Read the data by channel.
      for (channel = 0; channel < 4; channel++) {
         if (channel >= channelCount) {
            // Fill this channel with default data.
            if (bitdepth == 16 && bpc == 16) {
               stbi__uint16 *q = ((stbi__uint16 *) out) + channel;
               stbi__uint16 val = channel == 3 ? 65535 : 0;
               for (i = 0; i < pixelCount; i++, q += 4)
                  *q = val;
            } else {
               stbi_uc *p = out+channel;
               stbi_uc val = channel == 3 ? 255 : 0;
               for (i = 0; i < pixelCount; i++, p += 4)
                  *p = val;
            }
         } else {
            if (ri->bits_per_channel == 16) {    // output bpc
               stbi__uint16 *q = ((stbi__uint16 *) out) + channel;
               for (i = 0; i < pixelCount; i++, q += 4)
                  *q = (stbi__uint16) stbi__get16be(s);
            } else {
               stbi_uc *p = out+channel;
               if (bitdepth == 16) {  // input bpc
                  for (i = 0; i < pixelCount; i++, p += 4)
                     *p = (stbi_uc) (stbi__get16be(s) >> 8);
               } else {
                  for (i = 0; i < pixelCount; i++, p += 4)
                     *p = stbi__get8(s);
               }
            }
         }
      }
   }

   // remove weird white matte from PSD
   if (channelCount >= 4) {
      if (ri->bits_per_channel == 16) {
         for (i=0; i < w*h; ++i) {
            stbi__uint16 *pixel = (stbi__uint16 *) out + 4*i;
            if (pixel[3] != 0 && pixel[3] != 65535) {
               float a = pixel[3] / 65535.0f;
               float ra = 1.0f / a;
               float inv_a = 65535.0f * (1 - ra);
               pixel[0] = (stbi__uint16) (pixel[0]*ra + inv_a);
               pixel[1] = (stbi__uint16) (pixel[1]*ra + inv_a);
               pixel[2] = (stbi__uint16) (pixel[2]*ra + inv_a);
            }
         }
      } else {
         for (i=0; i < w*h; ++i) {
            unsigned char *pixel = out + 4*i;
            if (pixel[3] != 0 && pixel[3] != 255) {
               float a = pixel[3] / 255.0f;
               float ra = 1.0f / a;
               float inv_a = 255.0f * (1 - ra);
               pixel[0] = (unsigned char) (pixel[0]*ra + inv_a);
               pixel[1] = (unsigned char) (pixel[1]*ra + inv_a);
               pixel[2] = (unsigned char) (pixel[2]*ra + inv_a);
            }
         }
      }
   }

   // convert to desired output format
   if (req_comp && req_comp != 4) {
      if (ri->bits_per_channel == 16)
         out = (stbi_uc *) stbi__convert_format16((stbi__uint16 *) out, 4, req_comp, w, h);
      else
         out = stbi__convert_format(out, 4, req_comp, w, h);
      if (out == NULL) return out; // stbi__convert_format frees input on failure
   }

   if (comp) *comp = 4;
   *y = h;
   *x = w;

   return out;
}